

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iwmmxt_helper.c
# Opt level: O1

uint64_t helper_iwmmxt_sadb_aarch64(uint64_t a,uint64_t b)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  
  uVar3 = (uint)a & 0xff;
  uVar2 = (uint)b & 0xff;
  iVar4 = uVar3 - uVar2;
  iVar1 = -(uVar2 + uVar3);
  if (-1 < iVar4) {
    iVar1 = iVar4;
  }
  uVar3 = (uint)(a >> 8) & 0xff;
  uVar2 = (uint)(b >> 8) & 0xff;
  iVar9 = uVar3 - uVar2;
  iVar4 = -(uVar2 + uVar3);
  if (-1 < iVar9) {
    iVar4 = iVar9;
  }
  uVar3 = (uint)(a >> 0x10) & 0xff;
  uVar2 = (uint)(b >> 0x10) & 0xff;
  iVar10 = uVar3 - uVar2;
  iVar9 = -(uVar2 + uVar3);
  if (-1 < iVar10) {
    iVar9 = iVar10;
  }
  uVar3 = (uint)(a >> 0x18) & 0xff;
  uVar2 = (uint)(b >> 0x18) & 0xff;
  iVar11 = uVar3 - uVar2;
  iVar10 = -(uVar2 + uVar3);
  if (-1 < iVar11) {
    iVar10 = iVar11;
  }
  uVar13 = (uint)(a >> 0x20);
  uVar12 = uVar13 & 0xff;
  uVar3 = (uint)(b >> 0x20);
  uVar2 = uVar3 & 0xff;
  iVar5 = uVar12 - uVar2;
  iVar11 = -(uVar2 + uVar12);
  if (-1 < iVar5) {
    iVar11 = iVar5;
  }
  uVar2 = uVar13 >> 8 & 0xff;
  uVar3 = uVar3 >> 8 & 0xff;
  iVar6 = uVar2 - uVar3;
  iVar5 = -(uVar3 + uVar2);
  if (-1 < iVar6) {
    iVar5 = iVar6;
  }
  uVar3 = (ushort)(a >> 0x30) & 0xff;
  uVar2 = (ushort)(b >> 0x30) & 0xff;
  iVar7 = uVar3 - uVar2;
  iVar6 = -(uVar2 + uVar3);
  if (-1 < iVar7) {
    iVar6 = iVar7;
  }
  uVar3 = (uint)(byte)(a >> 0x38);
  uVar2 = (uint)(byte)(b >> 0x38);
  iVar8 = uVar3 - uVar2;
  iVar7 = -(uVar3 + uVar2);
  if (-1 < iVar8) {
    iVar7 = iVar8;
  }
  return (long)(iVar5 + iVar11 + iVar6 + iVar9 + iVar4 + iVar7 + iVar10 + iVar1);
}

Assistant:

uint64_t HELPER(iwmmxt_sadb)(uint64_t a, uint64_t b)
{
#define abs(x) (((x) >= 0) ? x : -x)
#define SADB(SHR) abs((int) ((a >> SHR) & 0xff) - (int) ((b >> SHR) & 0xff))
    return
        SADB(0) + SADB(8) + SADB(16) + SADB(24) +
        SADB(32) + SADB(40) + SADB(48) + SADB(56);
#undef SADB
}